

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::Mesh::draw_pick(Mesh *this,int *pickID,bool transformed)

{
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *plVar1;
  float fVar2;
  _List_node_base *p_Var3;
  double dVar4;
  pointer pVVar5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  undefined8 in_XMM1_Qa;
  undefined4 uVar8;
  undefined8 in_XMM2_Qa;
  undefined4 uVar9;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> originalPositions;
  Vector3D c;
  Vector3D q2;
  Vector3D b2;
  Vector3D q1;
  Vector3D p1;
  Vector3D b1;
  Vector3D r2;
  Vector3D r1;
  Vector3D a1;
  Vector3D p2;
  Vector3D a2;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> local_1a8;
  _List_node_base *local_190;
  _List_node_base *local_188;
  Vector3D local_180;
  Vector3D local_168;
  Vector3D local_148;
  Vector3D local_128;
  Vector3D local_108;
  Vector3D local_e8;
  Vector3D local_c8;
  Vector3D local_a8;
  Vector3D local_88;
  Vector3D local_68;
  Vector3D local_48;
  
  uVar9 = (undefined4)((ulong)in_XMM2_Qa >> 0x20);
  uVar8 = (undefined4)((ulong)in_XMM1_Qa >> 0x20);
  std::
  _Rb_tree<int,_std::pair<const_int,_CMU462::HalfedgeElement_*>,_std::_Select1st<std::pair<const_int,_CMU462::HalfedgeElement_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::HalfedgeElement_*>_>_>
  ::clear(&(this->idToElement)._M_t);
  if ((this->super_SceneObject).isGhosted == false) {
    local_1a8.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (transformed) {
      glPushMatrix();
      glTranslatef((float)(this->super_SceneObject).position.x,
                   CONCAT44(uVar8,(float)(this->super_SceneObject).position.y),
                   CONCAT44(uVar9,(float)(this->super_SceneObject).position.z));
      glRotatef((float)(this->super_SceneObject).rotation.x,0x3f800000,0,0);
      glRotatef((float)(this->super_SceneObject).rotation.y,0,0x3f800000,0);
      glRotatef((float)(this->super_SceneObject).rotation.z,0,0,0x3f800000);
      glScalef((float)(this->super_SceneObject).scale.x,(float)(this->super_SceneObject).scale.y,
               (float)(this->super_SceneObject).scale.z);
      plVar1 = &(this->mesh).vertices;
      p_Var6 = (this->mesh).vertices.
               super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node.
               super__List_node_base._M_next;
      if (p_Var6 != (_List_node_base *)plVar1) {
        do {
          std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
                    (&local_1a8,(value_type *)&p_Var6[1]._M_prev);
          fVar2 = *(float *)((long)&p_Var6[6]._M_prev + 4);
          Vertex::normal(&local_180,(Vertex *)(p_Var6 + 1));
          dVar4 = (double)fVar2;
          p_Var6[1]._M_prev = (_List_node_base *)(local_180.x * dVar4 + (double)p_Var6[1]._M_prev);
          p_Var6[2]._M_next = (_List_node_base *)(local_180.y * dVar4 + (double)p_Var6[2]._M_next);
          p_Var6[2]._M_prev = (_List_node_base *)(dVar4 * local_180.z + (double)p_Var6[2]._M_prev);
          p_Var6 = p_Var6->_M_next;
        } while (p_Var6 != (_List_node_base *)plVar1);
      }
    }
    local_190 = (_List_node_base *)&(this->mesh).faces;
    p_Var6 = (this->mesh).faces.super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    if (p_Var6 != local_190) {
      do {
        local_188 = p_Var6 + 1;
        (*(code *)(p_Var6[1]._M_next)->_M_next)(&local_180);
        p_Var7 = p_Var6[0xb]._M_prev;
        do {
          p_Var3 = p_Var7[2]._M_next;
          local_88.z = 0.0;
          local_88.x = 0.0;
          local_88.y = 0.0;
          local_e8.z = 0.0;
          local_e8.x = 0.0;
          local_e8.y = 0.0;
          local_108.z = 0.0;
          local_108.x = 0.0;
          local_108.y = 0.0;
          local_128.z = 0.0;
          local_128.x = 0.0;
          local_128.y = 0.0;
          local_a8.z = 0.0;
          local_a8.x = 0.0;
          local_a8.y = 0.0;
          local_48.z = 0.0;
          local_48.x = 0.0;
          local_48.y = 0.0;
          local_148.z = 0.0;
          local_148.x = 0.0;
          local_148.y = 0.0;
          local_68.z = 0.0;
          local_68.x = 0.0;
          local_68.y = 0.0;
          local_168.z = 0.0;
          local_168.x = 0.0;
          local_168.y = 0.0;
          local_c8.z = 0.0;
          local_c8.x = 0.0;
          local_c8.y = 0.0;
          Halfedge::getPickPoints
                    ((Halfedge *)(p_Var7 + 1),&local_88,&local_e8,&local_108,&local_128,&local_a8);
          Halfedge::getPickPoints
                    ((Halfedge *)(p_Var3 + 1),&local_48,&local_148,&local_68,&local_168,&local_c8);
          glBegin(4);
          newPickElement(this,pickID,
                         (HalfedgeElement *)(*(_List_node_base **)((long)(p_Var3 + 2) + 8) + 1));
          glVertex3dv(&local_88);
          glVertex3dv(&local_108);
          glVertex3dv(&local_a8);
          newPickElement(this,pickID,(HalfedgeElement *)local_188);
          glVertex3dv(&local_e8);
          glVertex3dv(&local_148);
          glVertex3dv(&local_180);
          glEnd();
          glBegin(7);
          newPickElement(this,pickID,(HalfedgeElement *)((long)p_Var3[3]._M_next + 0x10));
          glVertex3dv(&local_108);
          glVertex3dv(&local_c8);
          glVertex3dv(&local_168);
          glVertex3dv(&local_128);
          newPickElement(this,pickID,(HalfedgeElement *)(p_Var3 + 1));
          glVertex3dv(&local_128);
          glVertex3dv(&local_168);
          glVertex3dv(&local_148);
          glVertex3dv(&local_e8);
          glEnd();
          p_Var7 = p_Var7[2]._M_next;
        } while (p_Var6[0xb]._M_prev != p_Var7);
        p_Var6 = p_Var6->_M_next;
      } while (p_Var6 != local_190);
    }
    if (transformed) {
      glPopMatrix();
      pVVar5 = local_1a8.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
               _M_impl.super__Vector_impl_data._M_start;
      for (p_Var6 = (this->mesh).vertices.
                    super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
                    _M_node.super__List_node_base._M_next;
          p_Var6 != (_List_node_base *)&(this->mesh).vertices; p_Var6 = p_Var6->_M_next) {
        p_Var6[2]._M_prev = (_List_node_base *)pVVar5->z;
        p_Var7 = (_List_node_base *)pVVar5->y;
        p_Var6[1]._M_prev = (_List_node_base *)pVVar5->x;
        p_Var6[2]._M_next = p_Var7;
        pVVar5 = pVVar5 + 1;
      }
    }
    if (local_1a8.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1a8.
                      super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1a8.
                            super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a8.
                            super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void Mesh::draw_pick( int& pickID, bool transformed )
{
   idToElement.clear();
   if (isGhosted) return;
   vector<Vector3D> originalPositions;

   if (transformed) {
     glPushMatrix();
     glTranslatef(position.x, position.y, position.z);
     glRotatef(rotation.x, 1.0f, 0.0f, 0.0f);
     glRotatef(rotation.y, 0.0f, 1.0f, 0.0f);
     glRotatef(rotation.z, 0.0f, 0.0f, 1.0f);
     glScalef(scale.x, scale.y, scale.z);
     for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
       originalPositions.push_back(v->position);
       v->position += v->offset * v->normal();
     }
   }

   for( FaceIter f = mesh.facesBegin(); f != mesh.facesEnd(); f++ )
   {
      Vector3D c = f->centroid();

      HalfedgeIter h = f->halfedge();
      do
      {

         HalfedgeIter h1 = h;
         HalfedgeIter h2 = h->next();

         Vector3D a1, b1, p1, q1, r1;
         Vector3D a2, b2, p2, q2, r2;

         h1->getPickPoints( a1, b1, p1, q1, r1 );
         h2->getPickPoints( a2, b2, p2, q2, r2 );

         glBegin( GL_TRIANGLES );

         // vertex
         newPickElement( pickID, elementAddress(h2->vertex()) );
         glVertex3dv( &a1.x );
         glVertex3dv( &p1.x );
         glVertex3dv( &r1.x );

         // face
         newPickElement( pickID, elementAddress(f) );
         glVertex3dv( &b1.x );
         glVertex3dv( &b2.x );
         glVertex3dv( &c.x );

         glEnd();

         glBegin( GL_QUADS );

         // edge
         newPickElement( pickID, elementAddress(h2->edge()) );
         glVertex3dv( &p1.x );
         glVertex3dv( &r2.x );
         glVertex3dv( &q2.x );
         glVertex3dv( &q1.x );

         // halfedge
         newPickElement( pickID, elementAddress(h2) );
         glVertex3dv( &q1.x );
         glVertex3dv( &q2.x );
         glVertex3dv( &b2.x );
         glVertex3dv( &b1.x );

         glEnd();

         h = h->next();
      }
      while( h != f->halfedge() );
   }

   if (transformed) {
     glPopMatrix();
     int i = 0;
     for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
       v->position = originalPositions[i++];
     }
   }
}